

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

int hex_decode(char *in_buf,uint in_size,void *out_buf,uint out_size)

{
  byte *pbVar1;
  char cVar2;
  uchar *out;
  uint uVar3;
  char *pcVar4;
  char *in;
  long lVar5;
  byte bVar6;
  byte bVar7;
  
  if (out_buf == (void *)0x0) {
    uVar3 = in_size >> 1;
  }
  else {
    uVar3 = 0xffffffff;
    if (in_size >> 1 <= out_size && (in_size & 1) == 0) {
      pcVar4 = in_buf + in_size;
      lVar5 = 0;
      do {
        if ((pcVar4 <= in_buf) ||
           (pbVar1 = (byte *)((long)out_buf + lVar5),
           (byte *)((ulong)out_size + (long)out_buf) <= pbVar1)) {
          return (int)lVar5;
        }
        cVar2 = *in_buf;
        if ((byte)(cVar2 - 0x30U) < 10) {
          bVar6 = cVar2 << 4;
        }
        else {
          if ((0x19 < (byte)(cVar2 + 0x9fU)) && (0x19 < (byte)(cVar2 + 0xbfU))) {
            return -1;
          }
          bVar6 = cVar2 * '\x10' + 0x90;
        }
        *pbVar1 = bVar6;
        cVar2 = in_buf[1];
        bVar7 = cVar2 - 0x30;
        if (9 < bVar7) {
          if ((byte)(cVar2 + 0x9fU) < 0x1a) {
            bVar7 = cVar2 + 0xa9;
          }
          else {
            if (0x19 < (byte)(cVar2 + 0xbfU)) {
              return -1;
            }
            bVar7 = cVar2 - 0x37;
          }
        }
        *pbVar1 = bVar6 | bVar7;
        in_buf = in_buf + 2;
        lVar5 = lVar5 + 1;
      } while( true );
    }
  }
  return uVar3;
}

Assistant:

int
hex_decode(const char* in_buf, unsigned in_size, void* out_buf, unsigned out_size)
{
    const char* in = in_buf;
    const char* in_end = in + in_size;
    unsigned char* out = (unsigned char*) out_buf;
    unsigned char* out_end = out + out_size;

    if(out_buf == NULL)
        return in_size / 2;

    if(in_size % 2 != 0)
        return -1;
    if(out_size < in_size / 2)
        return -1;

    in = in_buf;
    in_end = in + in_size;
    out = (unsigned char*) out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out < out_end) {
        if('0' <= *in  &&  *in <= '9')
            *out = (*in - '0') << 4;
        else if('a' <= *in  &&  *in <= 'z')
            *out = (*in - 'a' + 10) << 4;
        else if('A' <= *in  &&  *in <= 'Z')
            *out = (*in - 'A' + 10) << 4;
        else
            return -1;
        in++;

        if('0' <= *in  &&  *in <= '9')
            *out |= (*in - '0');
        else if('a' <= *in  &&  *in <= 'z')
            *out |= (*in - 'a' + 10);
        else if('A' <= *in  &&  *in <= 'Z')
            *out |= (*in - 'A' + 10);
        else
            return -1;
        in++;

        out++;
    }

    return out - (const unsigned char*) out_buf;
}